

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void google::protobuf::compiler::CodeGeneratorResponse::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  _func_int **pp_Var1;
  ulong uVar2;
  Arena *extraout_RDX;
  Arena *arena;
  uint unaff_EBP;
  string *value;
  MessageLite *this;
  
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    this = from_msg;
    MergeImpl();
    arena = extraout_RDX;
LAB_0014c75a:
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
LAB_0014c6ed:
    internal::ArenaStringPtr::Set<>((ArenaStringPtr *)this,value,arena);
  }
  else {
    if (*(int *)&from_msg[2]._vptr_MessageLite != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[1]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[1]._internal_metadata_,
                 Arena::CopyConstruct<google::protobuf::compiler::CodeGeneratorResponse_File>);
    }
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 0xf) == 0) goto LAB_0014c71a;
    if ((unaff_EBP & 1) != 0) {
      pp_Var1 = from_msg[3]._vptr_MessageLite;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      value = (string *)((ulong)pp_Var1 & 0xfffffffffffffffc);
      this = to_msg + 3;
      arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)arena & 1) != 0) goto LAB_0014c75a;
      goto LAB_0014c6ed;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    to_msg[3]._internal_metadata_.ptr_ = from_msg[3]._internal_metadata_.ptr_;
  }
  if ((unaff_EBP & 4) != 0) {
    *(undefined4 *)&to_msg[4]._vptr_MessageLite = *(undefined4 *)&from_msg[4]._vptr_MessageLite;
  }
  if ((unaff_EBP & 8) != 0) {
    *(undefined4 *)((long)&to_msg[4]._vptr_MessageLite + 4) =
         *(undefined4 *)((long)&from_msg[4]._vptr_MessageLite + 4);
  }
LAB_0014c71a:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void CodeGeneratorResponse::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<CodeGeneratorResponse*>(&to_msg);
  auto& from = static_cast<const CodeGeneratorResponse&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.CodeGeneratorResponse)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_file()->MergeFrom(
      from._internal_file());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_error(from._internal_error());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.supported_features_ = from._impl_.supported_features_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.minimum_edition_ = from._impl_.minimum_edition_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.maximum_edition_ = from._impl_.maximum_edition_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}